

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_4to8_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u32 xVar1;
  xxh_u32 xVar2;
  xxh_u32 xVar3;
  xxh_u64 len_00;
  xxh_u64 xVar4;
  XXH64_hash_t XVar5;
  ulong in_RCX;
  xxh_u64 keyed;
  xxh_u64 input64;
  xxh_u64 bitflip;
  xxh_u32 input2;
  xxh_u32 input1;
  
  xVar1 = XXH_swap32((xxh_u32)in_RCX);
  xVar2 = XXH_readLE32((void *)0x12b44e);
  xVar3 = XXH_readLE32((void *)0x12b465);
  len_00 = XXH_readLE64((void *)0x12b477);
  xVar4 = XXH_readLE64((void *)0x12b489);
  XVar5 = XXH3_rrmxmx(CONCAT44(xVar2,xVar3) ^ (len_00 ^ xVar4) - ((ulong)xVar1 << 0x20 ^ in_RCX),
                      len_00);
  return XVar5;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_len_4to8_64b(const xxh_u8* input, size_t len,
                                                const xxh_u8* secret,
                                                XXH64_hash_t seed) {
  XXH_ASSERT(input != NULL);
  XXH_ASSERT(secret != NULL);
  XXH_ASSERT(4 <= len && len < 8);
  seed ^= (xxh_u64)XXH_swap32((xxh_u32)seed) << 32;
  {
    xxh_u32 const input1 = XXH_readLE32(input);
    xxh_u32 const input2 = XXH_readLE32(input + len - 4);
    xxh_u64 const bitflip =
        (XXH_readLE64(secret + 8) ^ XXH_readLE64(secret + 16)) - seed;
    xxh_u64 const input64 = input2 + (((xxh_u64)input1) << 32);
    xxh_u64 const keyed = input64 ^ bitflip;
    return XXH3_rrmxmx(keyed, len);
  }
}